

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall backend::codegen::Codegen::translate_inst(Codegen *this,StoreInst *i)

{
  unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_> *in_RDI;
  VarId *unaff_retaddr;
  Codegen *in_stack_00000008;
  Value *in_stack_00000010;
  Codegen *in_stack_00000018;
  __single_object ins;
  VarId *other;
  VarId *in_stack_ffffffffffffff60;
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  *this_00;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *this_01;
  VarId local_60;
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  local_50;
  MemoryOperand *in_stack_ffffffffffffffc8;
  uint *in_stack_ffffffffffffffd0;
  OpCode *in_stack_ffffffffffffffd8;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> local_18 [3];
  
  translate_value_to_reg(in_stack_00000018,in_stack_00000010);
  other = &local_60;
  mir::inst::VarId::VarId(in_stack_ffffffffffffff60,other);
  this_00 = &local_50;
  translate_var_to_memory_arg(in_stack_00000008,unaff_retaddr);
  this_01 = local_18;
  std::make_unique<arm::LoadStoreInst,arm::OpCode,unsigned_int,arm::MemoryOperand>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
  unique_ptr<arm::LoadStoreInst,std::default_delete<arm::LoadStoreInst>,void>(this_01,in_RDI);
  std::
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ::push_back(this_00,(value_type *)other);
  std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr(this_01);
  std::unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_>::~unique_ptr
            ((unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_> *)this_00);
  return;
}

Assistant:

void Codegen::translate_inst(mir::inst::StoreInst& i) {
  auto ins = std::make_unique<LoadStoreInst>(
      arm::OpCode::StR, translate_value_to_reg(i.val),
      translate_var_to_memory_arg(i.dest));
  inst.push_back(std::move(ins));
}